

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O1

bool __thiscall ON_Mesh::TransposeSurfaceParameters(ON_Mesh *this)

{
  double dVar1;
  undefined8 uVar2;
  ON_2dPoint *pOVar3;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  ON_Interval temp;
  
  uVar2 = *(undefined8 *)&this->field_0x240;
  uVar4 = *(undefined8 *)&this->field_0x248;
  *(undefined8 *)&this->field_0x240 = *(undefined8 *)&this->field_0x250;
  *(undefined8 *)&this->field_0x248 = *(undefined8 *)&this->field_0x258;
  *(undefined8 *)&this->field_0x250 = uVar2;
  *(undefined8 *)&this->field_0x258 = uVar4;
  dVar1 = this->m_srf_scale[0];
  this->m_srf_scale[0] = this->m_srf_scale[1];
  this->m_srf_scale[1] = dVar1;
  lVar5 = (long)(this->m_S).super_ON_SimpleArray<ON_2dPoint>.m_count;
  if (0 < lVar5) {
    pOVar3 = (this->m_S).super_ON_SimpleArray<ON_2dPoint>.m_a;
    lVar6 = 0;
    do {
      uVar2 = *(undefined8 *)((long)&pOVar3->x + lVar6);
      *(undefined8 *)((long)&pOVar3->x + lVar6) = *(undefined8 *)((long)&pOVar3->y + lVar6);
      *(undefined8 *)((long)&pOVar3->y + lVar6) = uVar2;
      lVar6 = lVar6 + 0x10;
    } while (lVar5 * 0x10 != lVar6);
  }
  return true;
}

Assistant:

bool ON_Mesh::TransposeSurfaceParameters()
{
	// swap m_srf_domain 
	ON_Interval temp = m_srf_domain[0];
	m_srf_domain[0]  = m_srf_domain[1];
	m_srf_domain[1]  = temp;

	double t = m_srf_scale[0];
	m_srf_scale[0] = m_srf_scale[1];
  m_srf_scale[1] = t;

  int S_count = m_S.Count();
  ON_2dPoint* S_array = m_S.Array();
  for (int i = 0; i < S_count; i++ )
  {
    ON_2dPoint& S = S_array[i];
    t = S.x; S.x = S.y; S.y = t;
  }
  return true;
}